

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddAbs.c
# Opt level: O0

DdNode * cuddAddOrAbstractRecur(DdManager *manager,DdNode *f,DdNode *cube)

{
  DdNode *f_00;
  DdNode *pDVar1;
  DdNode *pDVar2;
  DdManager *T_00;
  DdManager *E_00;
  DdManager *local_70;
  DdHalfWord local_64;
  DdHalfWord local_5c;
  DdNode *one;
  DdNode *res2;
  DdNode *res1;
  DdNode *res;
  DdNode *E;
  DdNode *T;
  DdNode *cube_local;
  DdNode *f_local;
  DdManager *manager_local;
  
  pDVar1 = manager->one;
  manager_local = (DdManager *)f;
  if ((f->index != 0x7fffffff) && (cube != pDVar1)) {
    if (f->index == 0x7fffffff) {
      local_5c = f->index;
    }
    else {
      local_5c = manager->perm[f->index];
    }
    if (cube->index == 0x7fffffff) {
      local_64 = cube->index;
    }
    else {
      local_64 = manager->perm[cube->index];
    }
    if ((int)local_64 < (int)local_5c) {
      manager_local = (DdManager *)cuddAddOrAbstractRecur(manager,f,(cube->type).kids.T);
    }
    else {
      manager_local = (DdManager *)cuddCacheLookup2(manager,Cudd_addOrAbstract,f,cube);
      if (manager_local == (DdManager *)0x0) {
        pDVar2 = (f->type).kids.T;
        f_00 = (f->type).kids.E;
        if (f->index == cube->index) {
          res1 = cuddAddOrAbstractRecur(manager,pDVar2,(cube->type).kids.T);
          if (res1 == (DdNode *)0x0) {
            manager_local = (DdManager *)0x0;
          }
          else {
            *(int *)(((ulong)res1 & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)res1 & 0xfffffffffffffffe) + 4) + 1;
            if (res1 != pDVar1) {
              pDVar1 = cuddAddOrAbstractRecur(manager,f_00,(cube->type).kids.T);
              if (pDVar1 == (DdNode *)0x0) {
                Cudd_RecursiveDeref(manager,res1);
                return (DdNode *)0x0;
              }
              *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
              pDVar2 = cuddAddApplyRecur(manager,Cudd_addOr,res1,pDVar1);
              if (pDVar2 == (DdNode *)0x0) {
                Cudd_RecursiveDeref(manager,res1);
                Cudd_RecursiveDeref(manager,pDVar1);
                return (DdNode *)0x0;
              }
              *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
              Cudd_RecursiveDeref(manager,res1);
              Cudd_RecursiveDeref(manager,pDVar1);
              res1 = pDVar2;
            }
            cuddCacheInsert2(manager,Cudd_addOrAbstract,f,cube,res1);
            *(int *)(((ulong)res1 & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)res1 & 0xfffffffffffffffe) + 4) + -1;
            manager_local = (DdManager *)res1;
          }
        }
        else {
          T_00 = (DdManager *)cuddAddOrAbstractRecur(manager,pDVar2,cube);
          if (T_00 == (DdManager *)0x0) {
            manager_local = (DdManager *)0x0;
          }
          else {
            *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) + 1;
            E_00 = (DdManager *)cuddAddOrAbstractRecur(manager,f_00,cube);
            if (E_00 == (DdManager *)0x0) {
              Cudd_RecursiveDeref(manager,(DdNode *)T_00);
              manager_local = (DdManager *)0x0;
            }
            else {
              *(int *)(((ulong)E_00 & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)E_00 & 0xfffffffffffffffe) + 4) + 1;
              local_70 = T_00;
              if (T_00 != E_00) {
                local_70 = (DdManager *)
                           cuddUniqueInter(manager,f->index,(DdNode *)T_00,(DdNode *)E_00);
              }
              if (local_70 == (DdManager *)0x0) {
                Cudd_RecursiveDeref(manager,(DdNode *)T_00);
                Cudd_RecursiveDeref(manager,(DdNode *)E_00);
                manager_local = (DdManager *)0x0;
              }
              else {
                *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) =
                     *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) + -1;
                *(int *)(((ulong)E_00 & 0xfffffffffffffffe) + 4) =
                     *(int *)(((ulong)E_00 & 0xfffffffffffffffe) + 4) + -1;
                cuddCacheInsert2(manager,Cudd_addOrAbstract,f,cube,&local_70->sentinel);
                manager_local = local_70;
              }
            }
          }
        }
      }
    }
  }
  return &manager_local->sentinel;
}

Assistant:

DdNode *
cuddAddOrAbstractRecur(
  DdManager * manager,
  DdNode * f,
  DdNode * cube)
{
    DdNode      *T, *E, *res, *res1, *res2, *one;

    statLine(manager);
    one = DD_ONE(manager);

    /* Cube is guaranteed to be a cube at this point. */
    if (cuddIsConstant(f) || cube == one) {  
        return(f);
    }

    /* Abstract a variable that does not appear in f. */
    if (cuddI(manager,f->index) > cuddI(manager,cube->index)) {
        res = cuddAddOrAbstractRecur(manager, f, cuddT(cube));
        return(res);
    }

    if ((res = cuddCacheLookup2(manager, Cudd_addOrAbstract, f, cube)) != NULL) {
        return(res);
    }

    T = cuddT(f);
    E = cuddE(f);

    /* If the two indices are the same, so are their levels. */
    if (f->index == cube->index) {
        res1 = cuddAddOrAbstractRecur(manager, T, cuddT(cube));
        if (res1 == NULL) return(NULL);
        cuddRef(res1);
        if (res1 != one) {
            res2 = cuddAddOrAbstractRecur(manager, E, cuddT(cube));
            if (res2 == NULL) {
                Cudd_RecursiveDeref(manager,res1);
                return(NULL);
            }
            cuddRef(res2);
            res = cuddAddApplyRecur(manager, Cudd_addOr, res1, res2);
            if (res == NULL) {
                Cudd_RecursiveDeref(manager,res1);
                Cudd_RecursiveDeref(manager,res2);
                return(NULL);
            }
            cuddRef(res);
            Cudd_RecursiveDeref(manager,res1);
            Cudd_RecursiveDeref(manager,res2);
        } else {
            res = res1;
        }
        cuddCacheInsert2(manager, Cudd_addOrAbstract, f, cube, res);
        cuddDeref(res);
        return(res);
    } else { /* if (cuddI(manager,f->index) < cuddI(manager,cube->index)) */
        res1 = cuddAddOrAbstractRecur(manager, T, cube);
        if (res1 == NULL) return(NULL);
        cuddRef(res1);
        res2 = cuddAddOrAbstractRecur(manager, E, cube);
        if (res2 == NULL) {
            Cudd_RecursiveDeref(manager,res1);
            return(NULL);
        }
        cuddRef(res2);
        res = (res1 == res2) ? res1 :
            cuddUniqueInter(manager, (int) f->index, res1, res2);
        if (res == NULL) {
            Cudd_RecursiveDeref(manager,res1);
            Cudd_RecursiveDeref(manager,res2);
            return(NULL);
        }
        cuddDeref(res1);
        cuddDeref(res2);
        cuddCacheInsert2(manager, Cudd_addOrAbstract, f, cube, res);
        return(res);
    }

}